

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void hgdb::json::SymbolTable::walk_up<true>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  bool bVar1;
  pointer this;
  pointer __args;
  ScopeBase *__args_00;
  bool res_1;
  ScopeBase *s;
  uint64_t i;
  undefined1 local_31;
  undefined1 local_30 [7];
  bool res;
  const_reverse_iterator child;
  ScopeBase *parent;
  function<bool_(hgdb::json::ScopeBase_*)> *terminate_local;
  ScopeBase *scope_local;
  
  child.current._M_current =
       (__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
        )scope->parent;
  if (child.current._M_current !=
      (unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *)0x0) {
    ScopeBase::rbegin((ScopeBase *)&stack0xffffffffffffffd8);
    while( true ) {
      ScopeBase::rend((ScopeBase *)local_30);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
                               *)&stack0xffffffffffffffd8,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
                               *)local_30);
      if (!bVar1) break;
      this = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
                           *)&stack0xffffffffffffffd8);
      __args = std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>::
               get(this);
      local_31 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()(terminate,__args);
      if ((bool)local_31) {
        return;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>_>
                    *)&i,(int)&stack0xffffffffffffffd8);
    }
    for (s = (ScopeBase *)scope->index_; s != (ScopeBase *)0x0;
        s = (ScopeBase *)((long)&s[-1].index_ + 7)) {
      __args_00 = ScopeBase::operator[]
                            ((ScopeBase *)child.current._M_current,
                             (uint64_t)((long)&s[-1].index_ + 7));
      bVar1 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()(terminate,__args_00);
      if (bVar1) {
        return;
      }
    }
    walk_up<false>((ScopeBase *)child.current._M_current,terminate);
  }
  return;
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }